

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void __thiscall
vkt::anon_unknown_0::SubpassRenderer::SubpassRenderer
          (SubpassRenderer *this,Context *context,DeviceInterface *vk,VkDevice device,
          Allocator *allocator,VkRenderPass renderPass,VkFramebuffer framebuffer,
          VkCommandPool commandBufferPool,deUint32 queueFamilyIndex,
          vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
          *attachmentImages,
          vector<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>,_std::allocator<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>_>_>
          *attachmentViews,SubpassRenderInfo *renderInfo,
          vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
          *attachmentInfos)

{
  allocator<vk::VkWriteDescriptorSet> *this_00;
  VkBuffer buffer;
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)14>_> data_01;
  RefData<vk::Handle<(vk::HandleType)14>_> data_02;
  RefData<vk::Handle<(vk::HandleType)16>_> data_03;
  RefData<vk::Handle<(vk::HandleType)18>_> data_04;
  RefData<vk::Handle<(vk::HandleType)8>_> data_05;
  RefData<vk::Handle<(vk::HandleType)21>_> data_06;
  RefData<vk::Handle<(vk::HandleType)22>_> data_07;
  RefData<vk::VkCommandBuffer_s_*> data_08;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *pvVar2;
  vector<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>,_std::allocator<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>_>_>
  *pvVar3;
  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
  *pvVar4;
  bool bVar5;
  bool bVar6;
  deUint32 dVar7;
  VkImageLayout VVar8;
  VkFormat VVar9;
  uint uVar10;
  const_reference pvVar11;
  uint *puVar12;
  Maybe<vkt::(anonymous_namespace)::RenderQuad> *pMVar13;
  RenderQuad *this_01;
  const_reference pvVar14;
  TextureFormat TVar15;
  size_type sVar16;
  Handle<(vk::HandleType)19> *pHVar17;
  ProgramCollection<vk::ProgramBinary> *pPVar18;
  ProgramBinary *pPVar19;
  Handle<(vk::HandleType)14> *pHVar20;
  Handle<(vk::HandleType)16> *pHVar21;
  size_t sVar22;
  Handle<(vk::HandleType)8> *pHVar23;
  Allocation *pAVar24;
  VkDeviceMemory mem;
  VkDeviceSize memOffset;
  void *data_09;
  Handle<(vk::HandleType)21> *pHVar25;
  const_reference pvVar26;
  reference pvVar27;
  Handle<(vk::HandleType)22> *pHVar28;
  reference pvVar29;
  VkCommandBuffer_s **ppVVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  VkPushConstantRange **local_768;
  bool local_743;
  Move<vk::VkCommandBuffer_s_*> local_660;
  RefData<vk::VkCommandBuffer_s_*> local_640;
  undefined4 local_620 [2];
  VkWriteDescriptorSet write_2;
  VkDescriptorImageInfo imageInfo_2;
  VkWriteDescriptorSet write_1;
  VkDescriptorImageInfo imageInfo_1;
  VkWriteDescriptorSet write;
  VkDescriptorImageInfo imageInfo;
  VkImageLayout inputAttachmentLayout;
  bool isStencilFormat_1;
  bool isDepthFormat_1;
  TextureFormat format_1;
  Attachment attachmentInfo_1;
  uint local_4e0;
  deUint32 inputAttachmentNdx_1;
  deUint32 bindingIndex_1;
  vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_> imageInfos;
  undefined1 local_4b8 [8];
  vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> writes;
  RefData<vk::Handle<(vk::HandleType)22>_> local_480;
  undefined1 local_460 [8];
  VkDescriptorSetAllocateInfo allocateInfo;
  RefData<vk::Handle<(vk::HandleType)21>_> local_418;
  undefined1 local_3f8 [8];
  VkDescriptorPoolCreateInfo createInfo_1;
  VkDescriptorPoolSize poolSize;
  VkMemoryRequirements local_3a8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_390;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_380;
  Move<vk::Handle<(vk::HandleType)8>_> local_370;
  RefData<vk::Handle<(vk::HandleType)8>_> local_350;
  deUint64 local_330;
  VkShaderModule local_328;
  VkShaderModule local_320;
  VkRenderPass local_318;
  Move<vk::Handle<(vk::HandleType)18>_> local_310;
  RefData<vk::Handle<(vk::HandleType)18>_> local_2f0;
  Move<vk::Handle<(vk::HandleType)16>_> local_2d0;
  RefData<vk::Handle<(vk::HandleType)16>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  Move<vk::Handle<(vk::HandleType)14>_> local_250;
  RefData<vk::Handle<(vk::HandleType)14>_> local_230;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  Move<vk::Handle<(vk::HandleType)14>_> local_1d0;
  RefData<vk::Handle<(vk::HandleType)14>_> local_1b0;
  undefined1 local_190 [8];
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkDescriptorSetLayout descriptorSetLayout;
  RefData<vk::Handle<(vk::HandleType)19>_> local_138;
  undefined1 local_118 [8];
  VkDescriptorSetLayoutCreateInfo createInfo;
  VkDescriptorSetLayoutBinding binding;
  deUint32 bindingNdx;
  deUint32 bindingCount;
  bool isStencilFormat;
  bool isDepthFormat;
  TextureFormat format;
  Attachment attachmentInfo;
  deUint32 inputAttachmentNdx;
  deUint32 bindingIndex;
  RenderQuad *renderQuad;
  undefined1 local_88 [28];
  deUint32 colorAttachmentNdx;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  deUint32 subpassIndex;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vk_local;
  Context *context_local;
  SubpassRenderer *this_local;
  VkCommandPool commandBufferPool_local;
  VkFramebuffer framebuffer_local;
  VkRenderPass renderPass_local;
  
  SubpassRenderInfo::SubpassRenderInfo(&this->m_renderInfo,renderInfo);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(&this->m_commandBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_vertexShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::Move(&this->m_fragmentShaderModule);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_vertexBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_vertexBufferMemory);
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector(&this->m_colorAttachmentImages);
  ::vk::Handle<(vk::HandleType)9>::Handle(&this->m_depthStencilAttachmentImage);
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       SubpassRenderInfo::getSubpassIndex(renderInfo);
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          *)(local_88 + 0x18));
  for (local_88._20_4_ = 0; uVar31 = local_88._20_4_,
      dVar7 = SubpassRenderInfo::getColorAttachmentCount(renderInfo), pvVar2 = attachmentImages,
      (uint)uVar31 < dVar7; local_88._20_4_ = local_88._20_4_ + 1) {
    dVar7 = SubpassRenderInfo::getColorAttachmentIndex(renderInfo,local_88._20_4_);
    pvVar11 = std::
              vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
              ::operator[](pvVar2,(ulong)dVar7);
    std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
    push_back(&this->m_colorAttachmentImages,pvVar11);
  }
  SubpassRenderInfo::getDepthStencilAttachmentIndex((SubpassRenderInfo *)local_88);
  bVar5 = tcu::Maybe::operator_cast_to_bool((Maybe *)local_88);
  tcu::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)local_88);
  pvVar2 = attachmentImages;
  if (bVar5) {
    SubpassRenderInfo::getDepthStencilAttachmentIndex((SubpassRenderInfo *)&renderQuad);
    puVar12 = tcu::Maybe<unsigned_int>::operator*((Maybe<unsigned_int> *)&renderQuad);
    pvVar11 = std::
              vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
              ::operator[](pvVar2,(ulong)*puVar12);
    (this->m_depthStencilAttachmentImage).m_internal = pvVar11->m_internal;
    tcu::Maybe<unsigned_int>::~Maybe((Maybe<unsigned_int> *)&renderQuad);
  }
  pMVar13 = SubpassRenderInfo::getRenderQuad(renderInfo);
  bVar5 = tcu::Maybe::operator_cast_to_bool((Maybe *)pMVar13);
  if (bVar5) {
    pMVar13 = SubpassRenderInfo::getRenderQuad(renderInfo);
    this_01 = tcu::Maybe<vkt::(anonymous_namespace)::RenderQuad>::operator*(pMVar13);
    dVar7 = SubpassRenderInfo::getInputAttachmentCount(renderInfo);
    if (dVar7 != 0) {
      attachmentInfo.m_finalLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      for (attachmentInfo.m_initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
          VVar8 = SubpassRenderInfo::getInputAttachmentCount(renderInfo), pvVar4 = attachmentInfos,
          attachmentInfo.m_initialLayout < VVar8;
          attachmentInfo.m_initialLayout = attachmentInfo.m_initialLayout + VK_IMAGE_LAYOUT_GENERAL)
      {
        dVar7 = SubpassRenderInfo::getInputAttachmentIndex
                          (renderInfo,attachmentInfo.m_initialLayout);
        pvVar14 = std::
                  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ::operator[](pvVar4,(ulong)dVar7);
        format.order = pvVar14->m_format;
        format.type = pvVar14->m_samples;
        VVar9 = Attachment::getFormat((Attachment *)&format);
        TVar15 = ::vk::mapVkFormat(VVar9);
        bindingCount = TVar15.order;
        bVar5 = tcu::hasDepthComponent(bindingCount);
        bVar6 = tcu::hasStencilComponent(bindingCount);
        local_743 = false;
        if (bVar5) {
          local_743 = bVar6;
        }
        uVar10 = 1;
        if (local_743 != false) {
          uVar10 = 2;
        }
        for (binding.pImmutableSamplers._4_4_ = 0; binding.pImmutableSamplers._4_4_ < uVar10;
            binding.pImmutableSamplers._4_4_ = binding.pImmutableSamplers._4_4_ + 1) {
          createInfo.pBindings._0_4_ = attachmentInfo.m_finalLayout;
          createInfo.pBindings._4_4_ = 10;
          std::
          vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ::push_back((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                       *)(local_88 + 0x18),(value_type *)&createInfo.pBindings);
          attachmentInfo.m_finalLayout = attachmentInfo.m_finalLayout + VK_IMAGE_LAYOUT_GENERAL;
        }
      }
      local_118._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
      createInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      createInfo._4_4_ = 0;
      createInfo.pNext._0_4_ = 0;
      sVar16 = std::
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               ::size((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                       *)(local_88 + 0x18));
      createInfo.pNext._4_4_ = (undefined4)sVar16;
      createInfo._16_8_ =
           std::
           vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           ::operator[]((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                         *)(local_88 + 0x18),0);
      ::vk::createDescriptorSetLayout
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetLayout,vk,device,
                 (VkDescriptorSetLayoutCreateInfo *)local_118,(VkAllocationCallbacks *)0x0);
      ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&descriptorSetLayout);
      data_00.deleter.m_deviceIface._0_4_ = (int)local_138.deleter.m_deviceIface;
      data_00.object.m_internal = local_138.object.m_internal;
      data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_138.deleter.m_deviceIface >> 0x20);
      data_00.deleter.m_device._0_4_ = (int)local_138.deleter.m_device;
      data_00.deleter.m_device._4_4_ = (int)((ulong)local_138.deleter.m_device >> 0x20);
      data_00.deleter.m_allocator = local_138.deleter.m_allocator;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
                (&this->m_descriptorSetLayout,data_00);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&descriptorSetLayout);
    }
    pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                        (&(this->m_descriptorSetLayout).
                          super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)pHVar17->m_internal;
    local_190._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
    pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    pipelineLayoutParams._4_4_ = 0;
    pipelineLayoutParams.pNext._0_4_ = 0;
    bVar5 = ::vk::refdetails::RefBase::operator_cast_to_bool
                      ((RefBase *)&this->m_descriptorSetLayout);
    pipelineLayoutParams.pNext._4_4_ = (uint)bVar5;
    bVar5 = ::vk::refdetails::RefBase::operator_cast_to_bool
                      ((RefBase *)&this->m_descriptorSetLayout);
    if (bVar5) {
      local_768 = &pipelineLayoutParams.pPushConstantRanges;
    }
    else {
      local_768 = (VkPushConstantRange **)0x0;
    }
    pipelineLayoutParams._16_8_ = local_768;
    pipelineLayoutParams.pSetLayouts._0_4_ = 0;
    pipelineLayoutParams.pushConstantRangeCount = 0;
    pipelineLayoutParams._36_4_ = 0;
    pPVar18 = Context::getBinaryCollection(context);
    de::toString<unsigned_int>
              (&local_210,
               (uint *)&bindings.
                        super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_1f0,&local_210,"-vert");
    pPVar19 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar18,&local_1f0);
    ::vk::createShaderModule(&local_1d0,vk,device,pPVar19,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_1b0,(Move *)&local_1d0);
    data_01.deleter.m_deviceIface._0_4_ = (int)local_1b0.deleter.m_deviceIface;
    data_01.object.m_internal = local_1b0.object.m_internal;
    data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1b0.deleter.m_deviceIface >> 0x20);
    data_01.deleter.m_device._0_4_ = (int)local_1b0.deleter.m_device;
    data_01.deleter.m_device._4_4_ = (int)((ulong)local_1b0.deleter.m_device >> 0x20);
    data_01.deleter.m_allocator = local_1b0.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (&this->m_vertexShaderModule,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    pPVar18 = Context::getBinaryCollection(context);
    de::toString<unsigned_int>
              (&local_290,
               (uint *)&bindings.
                        super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_270,&local_290,"-frag");
    pPVar19 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar18,&local_270);
    ::vk::createShaderModule(&local_250,vk,device,pPVar19,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_230,(Move *)&local_250);
    data_02.deleter.m_deviceIface._0_4_ = (int)local_230.deleter.m_deviceIface;
    data_02.object.m_internal = local_230.object.m_internal;
    data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_230.deleter.m_deviceIface >> 0x20);
    data_02.deleter.m_device._0_4_ = (int)local_230.deleter.m_device;
    data_02.deleter.m_device._4_4_ = (int)((ulong)local_230.deleter.m_device >> 0x20);
    data_02.deleter.m_allocator = local_230.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::operator=
              (&this->m_fragmentShaderModule,data_02);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_250);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    ::vk::createPipelineLayout
              (&local_2d0,vk,device,(VkPipelineLayoutCreateInfo *)local_190,
               (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_2b0,(Move *)&local_2d0);
    data_03.deleter.m_deviceIface._0_4_ = (int)local_2b0.deleter.m_deviceIface;
    data_03.object.m_internal = local_2b0.object.m_internal;
    data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2b0.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_device._0_4_ = (int)local_2b0.deleter.m_device;
    data_03.deleter.m_device._4_4_ = (int)((ulong)local_2b0.deleter.m_device >> 0x20);
    data_03.deleter.m_allocator = local_2b0.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
              (&this->m_pipelineLayout,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_2d0);
    local_318.m_internal = renderPass.m_internal;
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        (&(this->m_vertexShaderModule).
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    local_320.m_internal = pHVar20->m_internal;
    pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                        (&(this->m_fragmentShaderModule).
                          super_RefBase<vk::Handle<(vk::HandleType)14>_>);
    local_328.m_internal = pHVar20->m_internal;
    pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                        (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>);
    local_330 = pHVar21->m_internal;
    createSubpassPipeline
              (&local_310,vk,device,local_318,local_320,local_328,(VkPipelineLayout)local_330,
               &this->m_renderInfo);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_2f0,(Move *)&local_310);
    data_04.deleter.m_deviceIface._0_4_ = (int)local_2f0.deleter.m_deviceIface;
    data_04.object.m_internal = local_2f0.object.m_internal;
    data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2f0.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_device._0_4_ = (int)local_2f0.deleter.m_device;
    data_04.deleter.m_device._4_4_ = (int)((ulong)local_2f0.deleter.m_device >> 0x20);
    data_04.deleter.m_allocator = local_2f0.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(&this->m_pipeline,data_04);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_310);
    sVar22 = RenderQuad::getVertexDataSize(this_01);
    createBuffer(&local_370,vk,device,0,sVar22,0x80,VK_SHARING_MODE_EXCLUSIVE,1,&queueFamilyIndex);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_350,(Move *)&local_370);
    uVar31 = (undefined4)local_350.object.m_internal;
    uVar32 = (undefined4)(local_350.object.m_internal >> 0x20);
    uVar33 = SUB84(local_350.deleter.m_deviceIface,0);
    uVar34 = (undefined4)((ulong)local_350.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_deviceIface._0_4_ = uVar33;
    data_05.object.m_internal = local_350.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = uVar34;
    data_05.deleter.m_device._0_4_ = (int)local_350.deleter.m_device;
    data_05.deleter.m_device._4_4_ = (int)((ulong)local_350.deleter.m_device >> 0x20);
    data_05.deleter.m_allocator = local_350.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_vertexBuffer,data_05)
    ;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_370);
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    ::vk::getBufferMemoryRequirements(&local_3a8,vk,device,(VkBuffer)pHVar23->m_internal);
    (*allocator->_vptr_Allocator[3])
              (&local_390,allocator,&local_3a8,(ulong)::vk::MemoryRequirement::HostVisible);
    local_380 = de::details::MovePtr::operator_cast_to_PtrData(&local_390,(MovePtr *)allocator);
    data.ptr._4_4_ = uVar32;
    data.ptr._0_4_ = uVar31;
    data._8_4_ = uVar33;
    data._12_4_ = uVar34;
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
              (&this->m_vertexBufferMemory,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_390);
    pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        (&(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    buffer.m_internal = pHVar23->m_internal;
    pAVar24 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->(&(this->m_vertexBufferMemory).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    mem = ::vk::Allocation::getMemory(pAVar24);
    pAVar24 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->(&(this->m_vertexBufferMemory).
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    memOffset = ::vk::Allocation::getOffset(pAVar24);
    bindBufferMemory(vk,device,buffer,mem,memOffset);
    pAVar24 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator*(&(this->m_vertexBufferMemory).
                         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
    sVar22 = RenderQuad::getVertexDataSize(this_01);
    data_09 = RenderQuad::getVertexPointer(this_01);
    uploadBufferData(vk,device,pAVar24,sVar22,data_09);
    dVar7 = SubpassRenderInfo::getInputAttachmentCount(renderInfo);
    if (dVar7 != 0) {
      createInfo_1.pPoolSizes._0_4_ = 10;
      dVar7 = SubpassRenderInfo::getInputAttachmentCount(renderInfo);
      createInfo_1.pPoolSizes._4_4_ = dVar7 * 2;
      local_3f8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
      createInfo_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      createInfo_1._4_4_ = 0;
      createInfo_1.pNext._0_4_ = 1;
      dVar7 = SubpassRenderInfo::getInputAttachmentCount(renderInfo);
      createInfo_1.pNext._4_4_ = dVar7 * 2;
      createInfo_1.flags = 1;
      createInfo_1._24_8_ = &createInfo_1.pPoolSizes;
      ::vk::createDescriptorPool
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocateInfo.pSetLayouts,vk,device,
                 (VkDescriptorPoolCreateInfo *)local_3f8,(VkAllocationCallbacks *)0x0);
      ::vk::refdetails::Move::operator_cast_to_RefData(&local_418,(Move *)&allocateInfo.pSetLayouts)
      ;
      data_06.deleter.m_deviceIface._0_4_ = (int)local_418.deleter.m_deviceIface;
      data_06.object.m_internal = local_418.object.m_internal;
      data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_418.deleter.m_deviceIface >> 0x20);
      data_06.deleter.m_device._0_4_ = (int)local_418.deleter.m_device;
      data_06.deleter.m_device._4_4_ = (int)((ulong)local_418.deleter.m_device >> 0x20);
      data_06.deleter.m_allocator = local_418.deleter.m_allocator;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
                (&this->m_descriptorPool,data_06);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocateInfo.pSetLayouts);
      local_460._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
      allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      allocateInfo._4_4_ = 0;
      pHVar25 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                          (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>)
      ;
      allocateInfo.pNext = (void *)pHVar25->m_internal;
      allocateInfo.descriptorPool.m_internal._0_4_ = 1;
      allocateInfo._24_8_ = &pipelineLayoutParams.pPushConstantRanges;
      ::vk::allocateDescriptorSet
                ((Move<vk::Handle<(vk::HandleType)22>_> *)
                 &writes.
                  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,vk,device,
                 (VkDescriptorSetAllocateInfo *)local_460);
      ::vk::refdetails::Move::operator_cast_to_RefData
                (&local_480,
                 (Move *)&writes.
                          super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      data_07.deleter.m_deviceIface._0_4_ = (int)local_480.deleter.m_deviceIface;
      data_07.object.m_internal = local_480.object.m_internal;
      data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_480.deleter.m_deviceIface >> 0x20);
      data_07.deleter.m_device._0_4_ = (int)local_480.deleter.m_device;
      data_07.deleter.m_device._4_4_ = (int)((ulong)local_480.deleter.m_device >> 0x20);
      data_07.deleter.m_pool.m_internal = local_480.deleter.m_pool.m_internal;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
                (&this->m_descriptorSet,data_07);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
                ((Move<vk::Handle<(vk::HandleType)22>_> *)
                 &writes.
                  super__Vector_base<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar16 = std::
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               ::size((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                       *)(local_88 + 0x18));
      this_00 = (allocator<vk::VkWriteDescriptorSet> *)
                ((long)&imageInfos.
                        super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<vk::VkWriteDescriptorSet>::allocator(this_00);
      std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::vector
                ((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> *)
                 local_4b8,sVar16,this_00);
      std::allocator<vk::VkWriteDescriptorSet>::~allocator
                ((allocator<vk::VkWriteDescriptorSet> *)
                 ((long)&imageInfos.
                         super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      sVar16 = std::
               vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
               ::size((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                       *)(local_88 + 0x18));
      std::allocator<vk::VkDescriptorImageInfo>::allocator
                ((allocator<vk::VkDescriptorImageInfo> *)((long)&inputAttachmentNdx_1 + 3));
      std::vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::vector
                ((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_> *)
                 &bindingIndex_1,sVar16,
                 (allocator<vk::VkDescriptorImageInfo> *)((long)&inputAttachmentNdx_1 + 3));
      std::allocator<vk::VkDescriptorImageInfo>::~allocator
                ((allocator<vk::VkDescriptorImageInfo> *)((long)&inputAttachmentNdx_1 + 3));
      local_4e0 = 0;
      for (attachmentInfo_1.m_finalLayout = VK_IMAGE_LAYOUT_UNDEFINED;
          VVar8 = SubpassRenderInfo::getInputAttachmentCount(renderInfo), pvVar4 = attachmentInfos,
          attachmentInfo_1.m_finalLayout < VVar8;
          attachmentInfo_1.m_finalLayout = attachmentInfo_1.m_finalLayout + VK_IMAGE_LAYOUT_GENERAL)
      {
        dVar7 = SubpassRenderInfo::getInputAttachmentIndex
                          (renderInfo,attachmentInfo_1.m_finalLayout);
        pvVar14 = std::
                  vector<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ::operator[](pvVar4,(ulong)dVar7);
        format_1.order = pvVar14->m_format;
        format_1.type = pvVar14->m_samples;
        VVar9 = Attachment::getFormat((Attachment *)&format_1);
        TVar15 = ::vk::mapVkFormat(VVar9);
        inputAttachmentLayout = TVar15.order;
        bVar5 = tcu::hasDepthComponent(inputAttachmentLayout);
        bVar6 = tcu::hasStencilComponent(inputAttachmentLayout);
        VVar8 = SubpassRenderInfo::getInputAttachmentLayout
                          (renderInfo,attachmentInfo_1.m_finalLayout);
        if ((bVar5) && (bVar6)) {
          ::vk::Handle<(vk::HandleType)20>::Handle
                    ((Handle<(vk::HandleType)20> *)&write.pTexelBufferView,0);
          pvVar3 = attachmentViews;
          dVar7 = SubpassRenderInfo::getInputAttachmentIndex
                            (renderInfo,attachmentInfo_1.m_finalLayout);
          pvVar26 = std::
                    vector<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>,_std::allocator<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>_>_>
                    ::operator[](pvVar3,(ulong)dVar7);
          dVar1 = (pvVar26->first).m_internal;
          pvVar27 = std::
                    vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::
                    operator[]((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                *)&bindingIndex_1,(ulong)local_4e0);
          pvVar27->imageLayout = VVar8;
          (pvVar27->sampler).m_internal = (deUint64)write.pTexelBufferView;
          (pvVar27->imageView).m_internal = dVar1;
          write.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          write._4_4_ = 0;
          pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                              (&(this->m_descriptorSet).
                                super_RefBase<vk::Handle<(vk::HandleType)22>_>);
          write.pNext = (void *)pHVar28->m_internal;
          write.dstSet.m_internal._0_4_ = local_4e0;
          write.dstSet.m_internal._4_4_ = 0;
          write.dstBinding = 1;
          write.dstArrayElement = 10;
          write._32_8_ = std::
                         vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                         ::operator[]((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                       *)&bindingIndex_1,(ulong)local_4e0);
          write.pImageInfo = (VkDescriptorImageInfo *)0x0;
          write.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
          pvVar29 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ::operator[]((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                                  *)local_4b8,(ulong)local_4e0);
          pvVar29->pBufferInfo = (VkDescriptorBufferInfo *)write.pImageInfo;
          pvVar29->pTexelBufferView = (VkBufferView *)write.pBufferInfo;
          pvVar29->descriptorCount = write.dstBinding;
          pvVar29->descriptorType = write.dstArrayElement;
          pvVar29->pImageInfo = (VkDescriptorImageInfo *)write._32_8_;
          (pvVar29->dstSet).m_internal = (deUint64)write.pNext;
          pvVar29->dstBinding = (uint)write.dstSet.m_internal;
          pvVar29->dstArrayElement = write.dstSet.m_internal._4_4_;
          *(ulong *)pvVar29 = CONCAT44(imageInfo_1._20_4_,0x23);
          pvVar29->pNext = (void *)write._0_8_;
          uVar10 = local_4e0 + 1;
          ::vk::Handle<(vk::HandleType)20>::Handle
                    ((Handle<(vk::HandleType)20> *)&write_1.pTexelBufferView,0);
          pvVar3 = attachmentViews;
          dVar7 = SubpassRenderInfo::getInputAttachmentIndex
                            (renderInfo,attachmentInfo_1.m_finalLayout);
          pvVar26 = std::
                    vector<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>,_std::allocator<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>_>_>
                    ::operator[](pvVar3,(ulong)dVar7);
          dVar1 = (pvVar26->second).m_internal;
          pvVar27 = std::
                    vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::
                    operator[]((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                *)&bindingIndex_1,(ulong)uVar10);
          (pvVar27->sampler).m_internal = (deUint64)write_1.pTexelBufferView;
          (pvVar27->imageView).m_internal = dVar1;
          pvVar27->imageLayout = VVar8;
          imageInfo_2.imageLayout = 0x23;
          write_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          write_1._4_4_ = 0;
          pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                              (&(this->m_descriptorSet).
                                super_RefBase<vk::Handle<(vk::HandleType)22>_>);
          write_1.pNext = (void *)pHVar28->m_internal;
          write_1.dstSet.m_internal._4_4_ = 0;
          write_1.dstBinding = 1;
          write_1.dstArrayElement = 10;
          write_1.dstSet.m_internal._0_4_ = uVar10;
          write_1._32_8_ =
               std::vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::
               operator[]((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                           *)&bindingIndex_1,(ulong)uVar10);
          write_1.pImageInfo = (VkDescriptorImageInfo *)0x0;
          write_1.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
          pvVar29 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ::operator[]((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                                  *)local_4b8,(ulong)uVar10);
          memcpy(pvVar29,&imageInfo_2.imageLayout,0x40);
          local_4e0 = local_4e0 + 2;
        }
        else {
          ::vk::Handle<(vk::HandleType)20>::Handle
                    ((Handle<(vk::HandleType)20> *)&write_2.pTexelBufferView,0);
          pvVar3 = attachmentViews;
          dVar7 = SubpassRenderInfo::getInputAttachmentIndex
                            (renderInfo,attachmentInfo_1.m_finalLayout);
          pvVar26 = std::
                    vector<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>,_std::allocator<std::pair<vk::Handle<(vk::HandleType)13>,_vk::Handle<(vk::HandleType)13>_>_>_>
                    ::operator[](pvVar3,(ulong)dVar7);
          imageInfo_2.sampler.m_internal = (pvVar26->first).m_internal;
          imageInfo_2.imageView.m_internal._0_4_ = VVar8;
          pvVar27 = std::
                    vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::
                    operator[]((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                *)&bindingIndex_1,(ulong)local_4e0);
          (pvVar27->sampler).m_internal = (deUint64)write_2.pTexelBufferView;
          (pvVar27->imageView).m_internal = imageInfo_2.sampler.m_internal;
          pvVar27->imageLayout = (VkImageLayout)imageInfo_2.imageView.m_internal;
          local_620[0] = 0x23;
          write_2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
          write_2._4_4_ = 0;
          pHVar28 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                              (&(this->m_descriptorSet).
                                super_RefBase<vk::Handle<(vk::HandleType)22>_>);
          write_2.pNext = (void *)pHVar28->m_internal;
          write_2.dstSet.m_internal._0_4_ = local_4e0;
          write_2.dstSet.m_internal._4_4_ = 0;
          write_2.dstBinding = 1;
          write_2.dstArrayElement = 10;
          write_2._32_8_ =
               std::vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::
               operator[]((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                           *)&bindingIndex_1,(ulong)local_4e0);
          write_2.pImageInfo = (VkDescriptorImageInfo *)0x0;
          write_2.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
          pvVar29 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                    ::operator[]((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                                  *)local_4b8,(ulong)local_4e0);
          memcpy(pvVar29,local_620,0x40);
          local_4e0 = local_4e0 + 1;
        }
      }
      sVar16 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::
               size((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> *)
                    local_4b8);
      pvVar29 = std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::
                operator[]((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>
                            *)local_4b8,0);
      (*vk->_vptr_DeviceInterface[0x3e])(vk,device,sVar16 & 0xffffffff,pvVar29,0,0);
      std::vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>::~vector
                ((vector<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_> *)
                 &bindingIndex_1);
      std::vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_>::~vector
                ((vector<vk::VkWriteDescriptorSet,_std::allocator<vk::VkWriteDescriptorSet>_> *)
                 local_4b8);
    }
  }
  bVar5 = SubpassRenderInfo::isSecondary(renderInfo);
  if (bVar5) {
    ::vk::allocateCommandBuffer
              (&local_660,vk,device,commandBufferPool,VK_COMMAND_BUFFER_LEVEL_SECONDARY);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_640,(Move *)&local_660);
    data_08.deleter.m_deviceIface._0_4_ = (int)local_640.deleter.m_deviceIface;
    data_08.object = local_640.object;
    data_08.deleter.m_deviceIface._4_4_ = (int)((ulong)local_640.deleter.m_deviceIface >> 0x20);
    data_08.deleter.m_device._0_4_ = (int)local_640.deleter.m_device;
    data_08.deleter.m_device._4_4_ = (int)((ulong)local_640.deleter.m_device >> 0x20);
    data_08.deleter.m_pool.m_internal = local_640.deleter.m_pool.m_internal;
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=(&this->m_commandBuffer,data_08);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_660);
    ppVVar30 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
    beginCommandBuffer(vk,*ppVVar30,2,renderPass,
                       (deUint32)
                       bindings.
                       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,framebuffer,0,0,0);
    ppVVar30 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
    pushRenderCommands(this,vk,*ppVVar30);
    ppVVar30 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->m_commandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
    endCommandBuffer(vk,*ppVVar30);
  }
  std::vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>::
  ~vector((vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
           *)(local_88 + 0x18));
  return;
}

Assistant:

SubpassRenderer (Context&										context,
					 const DeviceInterface&							vk,
					 VkDevice										device,
					 Allocator&										allocator,
					 VkRenderPass									renderPass,
					 VkFramebuffer									framebuffer,
					 VkCommandPool									commandBufferPool,
					 deUint32										queueFamilyIndex,
					 const vector<VkImage>&							attachmentImages,
					 const vector<pair<VkImageView, VkImageView> >&	attachmentViews,
					 const SubpassRenderInfo&						renderInfo,
					 const vector<Attachment>&						attachmentInfos)
		: m_renderInfo	(renderInfo)
	{
		const deUint32							subpassIndex	= renderInfo.getSubpassIndex();
		vector<VkDescriptorSetLayoutBinding>	bindings;

		for (deUint32 colorAttachmentNdx = 0; colorAttachmentNdx < renderInfo.getColorAttachmentCount();  colorAttachmentNdx++)
			m_colorAttachmentImages.push_back(attachmentImages[renderInfo.getColorAttachmentIndex(colorAttachmentNdx)]);

		if (renderInfo.getDepthStencilAttachmentIndex())
			m_depthStencilAttachmentImage = attachmentImages[*renderInfo.getDepthStencilAttachmentIndex()];

		if (renderInfo.getRenderQuad())
		{
			const RenderQuad&	renderQuad	= *renderInfo.getRenderQuad();

			if (renderInfo.getInputAttachmentCount() > 0)
			{
				deUint32								bindingIndex	= 0;

				for (deUint32 inputAttachmentNdx = 0; inputAttachmentNdx < renderInfo.getInputAttachmentCount(); inputAttachmentNdx++)
				{
					const Attachment			attachmentInfo	= attachmentInfos[renderInfo.getInputAttachmentIndex(inputAttachmentNdx)];
					const tcu::TextureFormat	format			= mapVkFormat(attachmentInfo.getFormat());
					const bool					isDepthFormat	= tcu::hasDepthComponent(format.order);
					const bool					isStencilFormat	= tcu::hasStencilComponent(format.order);
					const deUint32				bindingCount	= isDepthFormat && isStencilFormat ? 2u : 1u;

					for (deUint32 bindingNdx = 0; bindingNdx < bindingCount; bindingNdx++)
					{
						const VkDescriptorSetLayoutBinding binding =
						{
							bindingIndex,
							vk::VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,
							1u,
							vk::VK_SHADER_STAGE_FRAGMENT_BIT,
							DE_NULL
						};

						bindings.push_back(binding);
						bindingIndex++;
					}
				}

				const VkDescriptorSetLayoutCreateInfo createInfo =
				{
					vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
					DE_NULL,

					0u,
					(deUint32)bindings.size(),
					&bindings[0]
				};

				m_descriptorSetLayout = vk::createDescriptorSetLayout(vk, device, &createInfo);
			}

			const VkDescriptorSetLayout			descriptorSetLayout		= *m_descriptorSetLayout;
			const VkPipelineLayoutCreateInfo	pipelineLayoutParams	=
			{
				VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,			// sType;
				DE_NULL,												// pNext;
				(vk::VkPipelineLayoutCreateFlags)0,
				m_descriptorSetLayout ? 1u :0u ,						// setLayoutCount;
				m_descriptorSetLayout ? &descriptorSetLayout : DE_NULL,	// pSetLayouts;
				0u,														// pushConstantRangeCount;
				DE_NULL,												// pPushConstantRanges;
			};

			m_vertexShaderModule	= createShaderModule(vk, device, context.getBinaryCollection().get(de::toString(subpassIndex) + "-vert"), 0u);
			m_fragmentShaderModule	= createShaderModule(vk, device, context.getBinaryCollection().get(de::toString(subpassIndex) + "-frag"), 0u);
			m_pipelineLayout		= createPipelineLayout(vk, device, &pipelineLayoutParams);
			m_pipeline				= createSubpassPipeline(vk, device, renderPass, *m_vertexShaderModule, *m_fragmentShaderModule, *m_pipelineLayout, m_renderInfo);

			m_vertexBuffer			= createBuffer(vk, device, 0u, (VkDeviceSize)renderQuad.getVertexDataSize(), VK_BUFFER_USAGE_VERTEX_BUFFER_BIT, VK_SHARING_MODE_EXCLUSIVE, 1u, &queueFamilyIndex);
			m_vertexBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vk, device, *m_vertexBuffer), MemoryRequirement::HostVisible);

			bindBufferMemory(vk, device, *m_vertexBuffer, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset());
			uploadBufferData(vk, device, *m_vertexBufferMemory, renderQuad.getVertexDataSize(), renderQuad.getVertexPointer());

			if (renderInfo.getInputAttachmentCount() > 0)
			{
				{
					const VkDescriptorPoolSize poolSize =
					{
						vk::VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,
						// \note Reserve 2 per input attachment since depthStencil attachments require 2.
						renderInfo.getInputAttachmentCount() * 2u
					};
					const VkDescriptorPoolCreateInfo createInfo =
					{
						vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
						DE_NULL,
						VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

						// \note Reserve 2 per input attachment since depthStencil attachments require 2.
						renderInfo.getInputAttachmentCount() * 2u,
						1u,
						&poolSize
					};

					m_descriptorPool = vk::createDescriptorPool(vk, device, &createInfo);
				}
				{
					const VkDescriptorSetAllocateInfo	allocateInfo =
					{
						vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
						DE_NULL,

						*m_descriptorPool,
						1u,
						&descriptorSetLayout
					};

					m_descriptorSet = vk::allocateDescriptorSet(vk, device, &allocateInfo);
				}
				{
					vector<VkWriteDescriptorSet>	writes			(bindings.size());
					vector<VkDescriptorImageInfo>	imageInfos		(bindings.size());
					deUint32						bindingIndex	= 0;

					for (deUint32 inputAttachmentNdx = 0; inputAttachmentNdx < renderInfo.getInputAttachmentCount(); inputAttachmentNdx++)
					{
						const Attachment			attachmentInfo			= attachmentInfos[renderInfo.getInputAttachmentIndex(inputAttachmentNdx)];
						const tcu::TextureFormat	format					= mapVkFormat(attachmentInfo.getFormat());
						const bool					isDepthFormat			= tcu::hasDepthComponent(format.order);
						const bool					isStencilFormat			= tcu::hasStencilComponent(format.order);
						const VkImageLayout			inputAttachmentLayout	= renderInfo.getInputAttachmentLayout(inputAttachmentNdx);

						if (isDepthFormat && isStencilFormat)
						{
							{
								const VkDescriptorImageInfo	imageInfo =
								{
									(VkSampler)0,
									attachmentViews[renderInfo.getInputAttachmentIndex(inputAttachmentNdx)].first,
									inputAttachmentLayout
								};
								imageInfos[bindingIndex] = imageInfo;

								{
									const VkWriteDescriptorSet	write =
									{
										VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
										DE_NULL,

										*m_descriptorSet,
										bindingIndex,
										0u,
										1u,
										VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,
										&imageInfos[bindingIndex],
										DE_NULL,
										DE_NULL
									};
									writes[bindingIndex] = write;

									bindingIndex++;
								}
							}
							{
								const VkDescriptorImageInfo	imageInfo =
								{
									(VkSampler)0,
									attachmentViews[renderInfo.getInputAttachmentIndex(inputAttachmentNdx)].second,
									inputAttachmentLayout
								};
								imageInfos[bindingIndex] = imageInfo;

								{
									const VkWriteDescriptorSet	write =
									{
										VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
										DE_NULL,

										*m_descriptorSet,
										bindingIndex,
										0u,
										1u,
										VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,
										&imageInfos[bindingIndex],
										DE_NULL,
										DE_NULL
									};
									writes[bindingIndex] = write;

									bindingIndex++;
								}
							}
						}
						else
						{
							const VkDescriptorImageInfo	imageInfo =
							{
								(VkSampler)0,
								attachmentViews[renderInfo.getInputAttachmentIndex(inputAttachmentNdx)].first,
								inputAttachmentLayout
							};
							imageInfos[bindingIndex] = imageInfo;

							{
								const VkWriteDescriptorSet	write =
								{
									VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
									DE_NULL,

									*m_descriptorSet,
									bindingIndex,
									0u,
									1u,
									VK_DESCRIPTOR_TYPE_INPUT_ATTACHMENT,
									&imageInfos[bindingIndex],
									DE_NULL,
									DE_NULL
								};
								writes[bindingIndex] = write;

								bindingIndex++;
							}
						}
					}

					vk.updateDescriptorSets(device, (deUint32)writes.size(), &writes[0], 0u, DE_NULL);
				}
			}
		}

		if (renderInfo.isSecondary())
		{
			m_commandBuffer = allocateCommandBuffer(vk, device, commandBufferPool, VK_COMMAND_BUFFER_LEVEL_SECONDARY);

			beginCommandBuffer(vk, *m_commandBuffer, vk::VK_COMMAND_BUFFER_USAGE_RENDER_PASS_CONTINUE_BIT, renderPass, subpassIndex, framebuffer, VK_FALSE, (VkQueryControlFlags)0, (VkQueryPipelineStatisticFlags)0);
			pushRenderCommands(vk, *m_commandBuffer);
			endCommandBuffer(vk, *m_commandBuffer);
		}
	}